

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O3

string * __thiscall
ZXing::Content::text_abi_cxx11_(string *__return_storage_ptr__,Content *this,TextMode mode)

{
  pointer pcVar1;
  ContentType CVar2;
  char *in_RCX;
  uint *puVar3;
  undefined7 in_register_00000011;
  ByteArray *bytes;
  undefined8 extraout_RDX;
  bool withECI;
  string *psVar4;
  string_view gs1;
  string_view utf8;
  string_view str;
  string local_58;
  string local_38;
  
  bytes = (ByteArray *)CONCAT71(in_register_00000011,mode);
  do {
    if ((char)bytes != '\x02') {
      puVar3 = &switchD_0013310d::switchdataD_0019154c;
      switch((ulong)bytes & 0xff) {
      case 0:
switchD_0013310d_caseD_0:
        withECI = false;
LAB_00133124:
        render_abi_cxx11_(__return_storage_ptr__,this,withECI);
        return __return_storage_ptr__;
      case 1:
        withECI = true;
        goto LAB_00133124;
      default:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      case 3:
        ToHex_abi_cxx11_(__return_storage_ptr__,(ZXing *)this,bytes);
        return __return_storage_ptr__;
      case 4:
        render_abi_cxx11_(&local_58,this,false);
        utf8._M_str = (char *)puVar3;
        utf8._M_len = (size_t)local_58._M_dataplus._M_p;
        EscapeNonGraphical_abi_cxx11_
                  (__return_storage_ptr__,(ZXing *)local_58._M_string_length,utf8);
      }
      goto LAB_0013318d;
    }
    CVar2 = type(this);
    if (CVar2 == Text) goto switchD_0013310d_caseD_0;
    if (CVar2 == ISO15434) {
      render_abi_cxx11_(&local_58,this,false);
      str._M_str = in_RCX;
      str._M_len = (size_t)local_58._M_dataplus._M_p;
      HRIFromISO15434_abi_cxx11_(__return_storage_ptr__,(ZXing *)local_58._M_string_length,str);
      goto LAB_0013318d;
    }
    bytes = (ByteArray *)CONCAT71((int7)((ulong)extraout_RDX >> 8),4);
  } while (CVar2 != GS1);
  render_abi_cxx11_(&local_58,this,false);
  gs1._M_str = in_RCX;
  gs1._M_len = (size_t)local_58._M_dataplus._M_p;
  HRIFromGS1_abi_cxx11_(&local_38,(ZXing *)local_58._M_string_length,gs1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = &local_38;
  if ((ZXing *)local_38._M_string_length == (ZXing *)0x0) {
    psVar4 = &local_58;
  }
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  if ((ZXing *)local_38._M_string_length == (ZXing *)0x0) {
    local_38._M_string_length = local_58._M_string_length;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             (ZXing *)(local_38._M_string_length + (long)pcVar1));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
LAB_0013318d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Content::text(TextMode mode) const
{
	switch (mode) {
	case TextMode::Plain: return render(false);
	case TextMode::ECI: return render(true);
	case TextMode::HRI:
		switch (type()) {
		case ContentType::GS1: {
			auto plain = render(false);
			auto hri = HRIFromGS1(plain);
			return hri.empty() ? plain : hri;
		}
		case ContentType::ISO15434: return HRIFromISO15434(render(false));
		case ContentType::Text: return render(false);
		default: return text(TextMode::Escaped);
		}
	case TextMode::Hex: return ToHex(bytes);
	case TextMode::Escaped: return EscapeNonGraphical(render(false));
	}

	return {}; // silence compiler warning
}